

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageOptions_UnrecognizedElectiveOption_Test::TestBody
          (CoapTest_CoapMessageOptions_UnrecognizedElectiveOption_Test *this)

{
  initializer_list<unsigned_char> __l;
  bool bVar1;
  char *pcVar2;
  element_type *this_00;
  AssertHelper local_110;
  Message local_108;
  int local_fc;
  size_t local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  ErrorCode local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0;
  void *local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  shared_ptr<ot::commissioner::coap::Message> message;
  Error error;
  allocator<unsigned_char> local_41;
  uchar local_40 [8];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  ByteArray buffer;
  CoapTest_CoapMessageOptions_UnrecognizedElectiveOption_Test *this_local;
  
  local_40[0] = '@';
  local_40[1] = 0;
  local_40[2] = 0;
  local_40[3] = 0;
  local_40[4] = 0xc3;
  local_40[5] = 0x11;
  local_40[6] = 0x22;
  local_40[7] = 0x33;
  local_38 = local_40;
  local_30 = 8;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_41);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,__l,&local_41);
  std::allocator<unsigned_char>::~allocator(&local_41);
  Error::Error((Error *)&message.
                         super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
  Message::Deserialize
            ((Message *)&gtest_ar.message_,
             (Error *)&message.
                       super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,(ByteArray *)local_28);
  local_a8 = (void *)0x0;
  testing::internal::CmpHelperNE<std::shared_ptr<ot::commissioner::coap::Message>,decltype(nullptr)>
            ((internal *)local_a0,"message","nullptr",
             (shared_ptr<ot::commissioner::coap::Message> *)&gtest_ar.message_,&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  local_cc = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_c8,"error","ErrorCode::kNone",
             (Error *)&message.
                       super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,&local_cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  this_00 = std::
            __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&gtest_ar.message_);
  local_f8 = Message::GetOptionNum(this_00);
  local_fc = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_f0,"message->GetOptionNum()","0",&local_f8,&local_fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::shared_ptr<ot::commissioner::coap::Message>::~shared_ptr
            ((shared_ptr<ot::commissioner::coap::Message> *)&gtest_ar.message_);
  Error::~Error((Error *)&message.
                          super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

TEST(CoapTest, CoapMessageOptions_UnrecognizedElectiveOption)
{
    ByteArray buffer{0x40, 0x00, 0x00, 0x00, 0xc3, 0x11, 0x22, 0x33};
    Error     error;

    auto message = Message::Deserialize(error, buffer);

    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);
    EXPECT_EQ(message->GetOptionNum(), 0);
}